

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.c
# Opt level: O0

char * get_response_statusline(cio_http_status_code status_code)

{
  char *pcStack_10;
  cio_http_status_code status_code_local;
  
  if (status_code == CIO_HTTP_STATUS_SWITCHING_PROTOCOLS) {
    pcStack_10 = "HTTP/1.1 101 Switching Protocols\r\nServer: cio http/0.0.1-1742+59956b85\r\n";
  }
  else if (status_code == CIO_HTTP_STATUS_OK) {
    pcStack_10 = "HTTP/1.1 200 OK\r\nServer: cio http/0.0.1-1742+59956b85\r\n";
  }
  else if (status_code == CIO_HTTP_STATUS_BAD_REQUEST) {
    pcStack_10 = "HTTP/1.1 400 Bad Request\r\nServer: cio http/0.0.1-1742+59956b85\r\n";
  }
  else if (status_code == CIO_HTTP_STATUS_NOT_FOUND) {
    pcStack_10 = "HTTP/1.1 404 Not Found\r\nServer: cio http/0.0.1-1742+59956b85\r\n";
  }
  else if (status_code == CIO_HTTP_STATUS_TIMEOUT) {
    pcStack_10 = "HTTP/1.1 408 Request Timeout\r\nServer: cio http/0.0.1-1742+59956b85\r\n";
  }
  else {
    pcStack_10 = "HTTP/1.1 500 Internal Server Error\r\nServer: cio http/0.0.1-1742+59956b85\r\n";
  }
  return pcStack_10;
}

Assistant:

static const char *get_response_statusline(enum cio_http_status_code status_code)
{
	switch (status_code) {
	case CIO_HTTP_STATUS_SWITCHING_PROTOCOLS:
		return CIO_HTTP_VERSION " 101 Switching Protocols" CIO_CRLF HTTP_SERVER_ID CIO_VERSION CIO_CRLF;
	case CIO_HTTP_STATUS_OK:
		return CIO_HTTP_VERSION " 200 OK" CIO_CRLF HTTP_SERVER_ID CIO_VERSION CIO_CRLF;
	case CIO_HTTP_STATUS_BAD_REQUEST:
		return CIO_HTTP_VERSION " 400 Bad Request" CIO_CRLF HTTP_SERVER_ID CIO_VERSION CIO_CRLF;
	case CIO_HTTP_STATUS_NOT_FOUND:
		return CIO_HTTP_VERSION " 404 Not Found" CIO_CRLF HTTP_SERVER_ID CIO_VERSION CIO_CRLF;
	case CIO_HTTP_STATUS_TIMEOUT:
		return CIO_HTTP_VERSION " 408 Request Timeout" CIO_CRLF HTTP_SERVER_ID CIO_VERSION CIO_CRLF;
	default:
		return CIO_HTTP_VERSION " 500 Internal Server Error" CIO_CRLF HTTP_SERVER_ID CIO_VERSION CIO_CRLF;
	}
}